

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O1

void run_CALL(WorkerP *w,Task *__dq_head)

{
  long lVar1;
  FILE *pFVar2;
  undefined1 auVar3 [8];
  __suseconds_t _Var4;
  BDD BVar5;
  MTBDD MVar6;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  MTBDD *pMVar10;
  ulong uVar11;
  BDD BVar12;
  MTBDD *a;
  ulong uVar13;
  double dVar14;
  double dVar15;
  BDD aBStack_c0 [2];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_b0;
  long local_a8;
  BDD local_a0;
  MTBDD local_98;
  BDD vars;
  undefined1 local_88 [8];
  timeval tv;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_48;
  BDD res;
  BDD temp;
  
  aBStack_c0[0] = 0x1035fe;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  auVar3 = local_88;
  local_a8 = tv.tv_sec;
  lVar1 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar10 = (MTBDD *)((long)aBStack_c0 + lVar1 + 8);
  if (size != 0) {
    uVar8 = 0;
    a = pMVar10;
    do {
      *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103640;
      MVar6 = mtbdd_ithvar((uint32_t)uVar8);
      *a = MVar6;
      *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10364b;
      mtbdd_protect(a);
      uVar8 = uVar8 + 1;
      a = a + 1;
    } while (uVar8 < size * size);
  }
  local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  res = 0x8000000000000000;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10367f;
  mtbdd_protect((MTBDD *)&local_48);
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103687;
  mtbdd_protect(&res);
  local_98 = 0x8000000000000000;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103696;
  mtbdd_protect(&local_98);
  if (size != 0) {
    uVar8 = 0;
    do {
      local_88 = (undefined1  [8])sylvan_and_WRAP;
      tv.tv_sec = 1;
      tv.tv_usec = local_98;
      *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1036dd;
      lace_run_task((Task *)local_88);
      local_98 = tv.tv_usec;
      uVar8 = uVar8 + 1;
    } while (uVar8 < size * size);
  }
  pFVar2 = _stdout;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103713;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  dVar15 = (double)(long)local_88;
  dVar14 = (double)tv.tv_sec;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103743;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",(dVar14 * 1e-06 + dVar15) - t_start);
  pFVar2 = _stdout;
  local_b0 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auVar3;
  if (report_minor == '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10378d;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rows...\n";
  }
  else {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103760;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1037c3;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  vars = (BDD)pMVar10;
  if (size != 0) {
    temp = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103805;
        printf("%zu... ");
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103814;
        fflush(_stdout);
      }
      if (size != 0) {
        uVar8 = 0;
        do {
          res = 0x8000000000000000;
          if (size != 0) {
            uVar11 = 0;
            do {
              if (uVar8 != uVar11) {
                local_88 = (undefined1  [8])sylvan_and_WRAP;
                tv.tv_sec = 1;
                tv.tv_usec = res;
                *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10388a;
                lace_run_task((Task *)local_88);
                res = tv.tv_usec;
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < size);
          }
          tv.tv_usec = res ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1038e7;
          lace_run_task((Task *)local_88);
          res = tv.tv_usec ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          tv.tv_usec = (__suseconds_t)local_48;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103917;
          lace_run_task((Task *)local_88);
          local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)tv.tv_usec;
          uVar8 = uVar8 + 1;
        } while (uVar8 < size);
      }
      temp = temp + 1;
    } while (temp < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10395e;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103983;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = (__suseconds_t)local_48;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1039e2;
    lace_run_task((Task *)local_88);
    BVar12 = temp;
    _Var4 = tv.tv_usec;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1039fe;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar12,_Var4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103a1f;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding columns... ";
  }
  else {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103a53;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding columns...\n";
  }
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103a89;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    temp = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103acb;
        printf("%zu... ");
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103ada;
        fflush(_stdout);
      }
      if (size != 0) {
        uVar8 = 0;
        do {
          res = 0x8000000000000000;
          if (size != 0) {
            uVar11 = 0;
            do {
              if (uVar8 != uVar11) {
                local_88 = (undefined1  [8])sylvan_and_WRAP;
                tv.tv_sec = 1;
                tv.tv_usec = res;
                *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103b4d;
                lace_run_task((Task *)local_88);
                res = tv.tv_usec;
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < size);
          }
          tv.tv_usec = res ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103b9e;
          lace_run_task((Task *)local_88);
          res = tv.tv_usec ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          tv.tv_usec = (__suseconds_t)local_48;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103bce;
          lace_run_task((Task *)local_88);
          local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)tv.tv_usec;
          uVar8 = uVar8 + 1;
        } while (uVar8 < size);
      }
      temp = temp + 1;
    } while (temp < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103c11;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103c36;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = (__suseconds_t)local_48;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103c95;
    lace_run_task((Task *)local_88);
    BVar12 = temp;
    _Var4 = tv.tv_usec;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103cb1;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar12,_Var4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103cd2;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rising diagonals... ";
  }
  else {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103d06;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding rising diagonals...\n";
  }
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103d3c;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    temp = vars;
    uVar8 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103d7c;
        printf("%zu... ");
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103d8b;
        fflush(_stdout);
      }
      if (size != 0) {
        uVar11 = 0;
        do {
          res = 0x8000000000000000;
          if (size != 0) {
            uVar13 = 0;
            do {
              if (((uVar8 != uVar13) && (uVar8 <= uVar13 + uVar11)) &&
                 (uVar13 + uVar11 < size + uVar8)) {
                local_88 = (undefined1  [8])sylvan_and_WRAP;
                tv.tv_sec = 1;
                tv.tv_usec = res;
                *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103e13;
                lace_run_task((Task *)local_88);
                res = tv.tv_usec;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < size);
          }
          tv.tv_usec = res ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103e7b;
          lace_run_task((Task *)local_88);
          res = tv.tv_usec ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          tv.tv_usec = (__suseconds_t)local_48;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103eac;
          lace_run_task((Task *)local_88);
          local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)tv.tv_usec;
          uVar11 = uVar11 + 1;
        } while (uVar11 < size);
      }
      uVar8 = uVar8 + 1;
      temp = temp - 8;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103ef0;
    putchar(10);
  }
  BVar12 = vars;
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103f1c;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = (__suseconds_t)local_48;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103f7b;
    lace_run_task((Task *)local_88);
    BVar5 = temp;
    _Var4 = tv.tv_usec;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103f97;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar5,_Var4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103fb8;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding falling diagonals... ";
  }
  else {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x103fec;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Encoding falling diagonals...\n";
  }
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104022;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    local_a0 = BVar12;
    uVar8 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10405e;
        printf("%zu... ");
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10406d;
        fflush(_stdout);
      }
      if (size != 0) {
        temp = 0;
        BVar12 = local_a0;
        do {
          res = 0x8000000000000000;
          aBStack_c0[1] = BVar12;
          if (size != 0) {
            uVar11 = temp + uVar8;
            uVar13 = 0;
            do {
              if (((uVar8 != uVar13) && (uVar13 <= uVar11)) && (uVar11 < size + uVar13)) {
                local_88 = (undefined1  [8])sylvan_and_WRAP;
                tv.tv_sec = 1;
                tv.tv_usec = res;
                *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10410b;
                lace_run_task((Task *)local_88);
                res = tv.tv_usec;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < size);
          }
          BVar12 = temp;
          tv.tv_usec = res ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10417e;
          lace_run_task((Task *)local_88);
          res = tv.tv_usec ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          tv.tv_usec = (__suseconds_t)local_48;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1041ae;
          lace_run_task((Task *)local_88);
          local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)tv.tv_usec;
          temp = BVar12 + 1;
          BVar12 = aBStack_c0[1] + 8;
        } while (temp < size);
      }
      uVar8 = uVar8 + 1;
      local_a0 = local_a0 + 8;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104200;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104225;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
    local_88 = (undefined1  [8])sylvan_satcount_WRAP;
    tv.tv_sec = 1;
    tv.tv_usec = (__suseconds_t)local_48;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104284;
    lace_run_task((Task *)local_88);
    BVar12 = temp;
    _Var4 = tv.tv_usec;
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1042a0;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",BVar12,_Var4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1042c1;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  else {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1042f5;
    gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)tv.tv_sec * 1e-06 + (double)(long)local_88;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row...\n";
  }
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10432b;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar8 = 0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104369;
        printf("%zu... ",uVar8);
        *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104378;
        fflush(_stdout);
      }
      res = 0;
      temp = uVar8;
      if (size != 0) {
        uVar8 = 0;
        do {
          tv.tv_usec = res ^ 0x8000000000000000;
          local_88 = (undefined1  [8])sylvan_and_WRAP;
          tv.tv_sec = 1;
          *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1043f0;
          lace_run_task((Task *)local_88);
          res = tv.tv_usec ^ 0x8000000000000000;
          uVar8 = uVar8 + 1;
        } while (uVar8 < size);
      }
      local_88 = (undefined1  [8])sylvan_and_WRAP;
      tv.tv_sec = 1;
      tv.tv_usec = (__suseconds_t)local_48;
      *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10444e;
      lace_run_task((Task *)local_88);
      local_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)tv.tv_usec;
      uVar8 = temp + 1;
    } while (uVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104484;
    putchar(10);
  }
  vars = (BDD)((double)local_a8 * 1e-06 + (double)(long)local_b0);
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1044be;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  pFVar2 = _stdout;
  vars = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - (double)vars);
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104504;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  sVar7 = size;
  temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
  local_88 = (undefined1  [8])sylvan_satcount_WRAP;
  tv.tv_sec = 1;
  tv.tv_usec = (__suseconds_t)local_48;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10456a;
  lace_run_task((Task *)local_88);
  BVar12 = temp;
  _Var4 = tv.tv_usec;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104589;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",BVar12,_Var4,sVar7);
  pFVar2 = _stdout;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x104597;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  temp = (BDD)(((double)tv.tv_sec * 1e-06 + (double)(long)local_88) - t_start);
  local_88 = (undefined1  [8])local_48;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1045d6;
  sVar7 = mtbdd_nodecount_more((MTBDD *)local_88,1);
  BVar12 = temp;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1045ef;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",BVar12,sVar7);
  pFVar2 = _stdout;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x1045fd;
  gettimeofday((timeval *)local_88,(__timezone_ptr_t)0x0);
  BVar12 = vars;
  dVar15 = (double)(long)local_88;
  dVar14 = (double)tv.tv_sec;
  *(undefined8 *)((long)aBStack_c0 + lVar1) = 0x10463b;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",(dVar14 * 1e-06 + dVar15) - t_start,BVar12);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}